

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::ModelDescription::ModelDescription(ModelDescription *this)

{
  ModelDescription *pMVar1;
  ModelDescription *this_local;
  
  google::protobuf::MessageLite::MessageLite(&this->super_MessageLite);
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__ModelDescription_00625390;
  google::protobuf::internal::InternalMetadataWithArenaLite::InternalMetadataWithArenaLite
            (&this->_internal_metadata_,(Arena *)0x0);
  google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::RepeatedPtrField
            (&this->input_);
  google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::RepeatedPtrField
            (&this->output_);
  google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::RepeatedPtrField
            (&this->traininginput_);
  pMVar1 = internal_default_instance();
  if (this != pMVar1) {
    protobuf_Model_2eproto::InitDefaults();
  }
  SharedCtor(this);
  return;
}

Assistant:

ModelDescription::ModelDescription()
  : ::google::protobuf::MessageLite(), _internal_metadata_(NULL) {
  if (GOOGLE_PREDICT_TRUE(this != internal_default_instance())) {
    protobuf_Model_2eproto::InitDefaults();
  }
  SharedCtor();
  // @@protoc_insertion_point(constructor:CoreML.Specification.ModelDescription)
}